

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::anon_unknown_17::MthdSyfmSrcSize::~MthdSyfmSrcSize(MthdSyfmSrcSize *this)

{
  MthdSyfmSrcSize *this_local;
  
  ~MthdSyfmSrcSize(this);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0x0fff0fff;
			val ^= 1 << (rnd() & 0x1f);
		}
		if (!(rnd() & 3)) {
			val &= ~0x7f0;
			val |= 0x400;
		}
		if (!(rnd() & 3)) {
			val &= ~0x7f00000;
			val |= 0x4000000;
		}
	}